

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O0

void anon_unknown.dwarf_91bd::fillChannels(Rand48 *random,FlatImage *img)

{
  LevelMode LVar1;
  int iVar2;
  ostream *poVar3;
  Image *in_RSI;
  FlatImageLevel *in_stack_00000008;
  Rand48 *in_stack_00000010;
  int x_1;
  int y;
  int x;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffc4;
  uint local_1c;
  uint local_18;
  uint local_14;
  
  LVar1 = Imf_2_5::Image::levelMode(in_RSI);
  if (LVar1 == ONE_LEVEL) {
    poVar3 = std::operator<<((ostream *)&std::cout,"        level 0");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    (*in_RSI->_vptr_Image[3])(in_RSI,0);
    fillChannels(in_stack_00000010,in_stack_00000008);
  }
  else if (LVar1 == MIPMAP_LEVELS) {
    for (local_14 = 0;
        iVar2 = Imf_2_5::Image::numLevels
                          ((Image *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)),
        (int)local_14 < iVar2; local_14 = local_14 + 1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"        level ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14);
      poVar3 = std::operator<<(poVar3,"");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      (*in_RSI->_vptr_Image[3])(in_RSI,(ulong)local_14);
      fillChannels(in_stack_00000010,in_stack_00000008);
    }
  }
  else {
    if (LVar1 != RIPMAP_LEVELS) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testFlatImage.cpp"
                    ,0x12d,"void (anonymous namespace)::fillChannels(Rand48 &, FlatImage &)");
    }
    local_18 = 0;
    while (uVar4 = local_18, iVar2 = Imf_2_5::Image::numYLevels((Image *)0x114df2),
          (int)uVar4 < iVar2) {
      local_1c = 0;
      while (uVar4 = local_1c, iVar2 = Imf_2_5::Image::numXLevels((Image *)0x114e1a),
            (int)uVar4 < iVar2) {
        poVar3 = std::operator<<((ostream *)&std::cout,"        level (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
        poVar3 = std::operator<<(poVar3,")");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        (*in_RSI->_vptr_Image[5])(in_RSI,(ulong)local_1c,(ulong)local_18);
        fillChannels(in_stack_00000010,in_stack_00000008);
        local_1c = local_1c + 1;
      }
      local_18 = local_18 + 1;
    }
  }
  return;
}

Assistant:

void
fillChannels (Rand48 &random, FlatImage &img)
{
    switch (img.levelMode())
    {
      case ONE_LEVEL:

        cout << "        level 0" << endl;
        fillChannels (random, img.level());

        break;

      case MIPMAP_LEVELS:

        for (int x = 0; x < img.numLevels(); ++x)
        {
            cout << "        level " << x << "" << endl;
            fillChannels (random, img.level (x));
        }

        break;

      case RIPMAP_LEVELS:

        for (int y = 0; y < img.numYLevels(); ++y)
        {
            for (int x = 0; x < img.numXLevels(); ++x)
            {
                cout << "        level (" << x << ", " << y << ")" << endl;
                fillChannels (random, img.level (x, y));
            }
        }

        break;

      default:

        assert (false);
    }
}